

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O3

void store_update(void)

{
  ushort uVar1;
  uint32_t uVar2;
  angband_constants *paVar3;
  void *p;
  uint16_t uVar4;
  int *piVar5;
  ulong uVar6;
  store_conflict *psVar7;
  long lVar8;
  
  paVar3 = z_info;
  psVar7 = stores;
  if ((player->opts).opt[0x1a] == true) {
    msg("Updating Shops...");
    paVar3 = z_info;
    psVar7 = stores;
  }
  while (z_info = paVar3, stores = psVar7, daycount != 0) {
    daycount = daycount - 1;
    uVar4 = paVar3->store_max;
    if (uVar4 != 0) {
      lVar8 = 0;
      uVar6 = 0;
      do {
        if (*(int *)((long)&psVar7->feat + lVar8) != 0xe) {
          store_maint((store_conflict *)((long)&psVar7->owners + lVar8));
          uVar4 = z_info->store_max;
          paVar3 = z_info;
          psVar7 = stores;
        }
        uVar6 = uVar6 + 1;
        lVar8 = lVar8 + 0x70;
      } while (uVar6 < uVar4);
    }
    uVar2 = Rand_div((uint)paVar3->store_shuffle);
    paVar3 = z_info;
    psVar7 = stores;
    if (uVar2 == 0) {
      p = mem_zalloc((ulong)z_info->store_max << 2);
      if ((player->opts).opt[0x1a] == true) {
        msg("Shuffling a Shopkeeper...");
      }
      uVar1 = z_info->store_max;
      if ((ulong)uVar1 != 0) {
        piVar5 = &stores->feat;
        uVar6 = 0;
        uVar2 = 0;
        do {
          if (*piVar5 != 0xe) {
            *(int *)((long)p + (long)(int)uVar2 * 4) = (int)uVar6;
            uVar2 = uVar2 + 1;
          }
          uVar6 = uVar6 + 1;
          piVar5 = piVar5 + 0x1c;
        } while (uVar1 != uVar6);
        if (0 < (int)uVar2) {
          uVar2 = Rand_div(uVar2);
          store_shuffle(stores + *(int *)((long)p + (long)(int)uVar2 * 4));
        }
      }
      mem_free(p);
      paVar3 = z_info;
      psVar7 = stores;
    }
  }
  daycount = 0;
  if ((player->opts).opt[0x1a] != true) {
    return;
  }
  msg("Done.");
  return;
}

Assistant:

void store_update(void)
{
	if (OPT(player, cheat_xtra)) msg("Updating Shops...");
	while (daycount--) {
		int n;

		/* Maintain each shop (except home) */
		for (n = 0; n < z_info->store_max; n++) {
			/* Skip the home */
			if (stores[n].feat == FEAT_HOME) continue;

			/* Maintain */
			store_maint(&stores[n]);
		}

		/* Sometimes, shuffle the shop-keepers */
		if (one_in_(z_info->store_shuffle)) {
			int *non_home_inds = mem_zalloc(z_info->store_max
				* sizeof(*non_home_inds));
			int n_without_home = 0;

			/* Message */
			if (OPT(player, cheat_xtra)) msg("Shuffling a Shopkeeper...");

			/* Pick a random shop (except home) */
			for (n = 0; n < z_info->store_max; n++) {
				if (stores[n].feat != FEAT_HOME) {
					non_home_inds[n_without_home] = n;
					++n_without_home;
				}
			}
			if (n_without_home > 0) {
				n = randint0(n_without_home);
				/* Then suffle it. */
				store_shuffle(&stores[non_home_inds[n]]);
			}
			mem_free(non_home_inds);
		}
	}
	daycount = 0;
	if (OPT(player, cheat_xtra)) msg("Done.");
}